

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O2

SeatDialogPromptDescriptions * tempseat_prompt_descriptions(Seat *seat)

{
  SeatDialogPromptDescriptions *pSVar1;
  
  pSVar1 = (SeatDialogPromptDescriptions *)(**(code **)((seat[-10].vt)->output + 0x78))();
  return pSVar1;
}

Assistant:

static const SeatDialogPromptDescriptions *tempseat_prompt_descriptions(
    Seat *seat)
{
    /* It might be OK to put this in the 'unreachable' category, but I
     * think it's equally good to put it here, which allows for
     * someone _preparing_ a prompt right now that they intend to
     * present once the TempSeat has given way to the real one. */
    TempSeat *ts = container_of(seat, TempSeat, seat);
    return seat_prompt_descriptions(ts->realseat);
}